

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O1

void __thiscall Solution::mutate_inversion(Solution *this)

{
  Vehicle *this_00;
  _List_node_base *p_Var1;
  int iVar2;
  mapped_type *pmVar3;
  _List_node_base *p_Var4;
  int iVar5;
  difference_type __d;
  ulong uVar6;
  _List_node_base *p_Var7;
  long *******ppppppplVar8;
  ulong uVar9;
  long *******ppppppplVar10;
  _List_node_base *p_Var11;
  int ec;
  list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> points_list;
  Solution *local_68;
  Solution *local_60;
  int local_54;
  long *******local_50;
  long *******local_48;
  long local_40;
  ulong local_38;
  
  p_Var7 = (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  iVar2 = rand();
  uVar6 = (ulong)(long)iVar2 %
          (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
          _M_size;
  if ((long)uVar6 < 1) {
    for (; uVar6 != 0; uVar6 = uVar6 + 1) {
      p_Var7 = p_Var7->_M_prev;
    }
  }
  else {
    do {
      p_Var7 = p_Var7->_M_next;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  this_00 = (Vehicle *)p_Var7[1]._M_next;
  if (2 < (this_00->nodes).
          super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
          ._M_impl._M_node._M_size) {
    local_60 = this;
    iVar2 = rand();
    uVar9 = (ulong)(long)iVar2 %
            ((this_00->nodes).
             super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
             ._M_impl._M_node._M_size - 2) + 2;
    iVar2 = rand();
    local_38 = (ulong)(long)iVar2 % uVar9;
    p_Var7 = (this_00->nodes).
             super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    uVar6 = local_38;
    p_Var11 = p_Var7;
    if ((long)local_38 < 1) {
      for (; uVar6 != 0; uVar6 = uVar6 + 1) {
        p_Var11 = p_Var11->_M_prev;
      }
    }
    else {
      do {
        p_Var11 = p_Var11->_M_next;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    if ((long)uVar9 < 1) {
      do {
        p_Var7 = p_Var7->_M_prev;
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0);
    }
    else {
      do {
        p_Var7 = p_Var7->_M_next;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    local_48 = (long *******)&local_50;
    local_50 = (long *******)&local_50;
    local_40 = 0;
    while (uVar6 = local_38, p_Var11 != p_Var7) {
      p_Var11 = p_Var11->_M_next;
      p_Var1 = (p_Var11[1]._M_next)->_M_next;
      local_68 = local_60;
      pmVar3 = std::__detail::
               _Map_base<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)(p_Var1 + 2),&local_68);
      iVar2 = pmVar3->second;
      p_Var4 = (_List_node_base *)operator_new(0x20);
      p_Var4[1]._M_next = p_Var1;
      *(int *)&p_Var4[1]._M_prev = iVar2;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      local_40 = local_40 + 1;
    }
    if ((long ********)local_50 != &local_50) {
      iVar2 = *(int *)(local_50 + 3);
      ppppppplVar10 = local_50;
      do {
        Vehicle::remove_node(this_00,iVar2);
        ppppppplVar10 = (long *******)*ppppppplVar10;
      } while ((long ********)ppppppplVar10 != &local_50);
    }
    if (&local_50 != (long ********)local_50) {
      iVar2 = 0;
      ppppppplVar10 = (long *******)&local_50;
      do {
        local_68 = (Solution *)((ulong)local_68 & 0xffffffff00000000);
        Vehicle::add_node(this_00,(Point *)ppppppplVar10[1][2],(int)uVar6 + iVar2,(int *)&local_68);
        iVar5 = iVar2 + 1;
        local_60 = (Solution *)CONCAT44(local_60._4_4_,(int)local_68);
        if ((int)local_68 != 0) {
          local_68 = (Solution *)((ulong)local_68 & 0xffffffff00000000);
          if (0 < iVar5) {
            iVar5 = 1;
          }
          local_54 = iVar5 + -1;
          iVar2 = iVar2 + 2;
          while (iVar2 = iVar2 + -1, ppppppplVar8 = (long *******)&local_50, 1 < iVar2) {
            Vehicle::remove_node(this_00,(int)uVar6);
          }
          while (ppppppplVar8 = (long *******)*ppppppplVar8, iVar5 = local_54,
                (long ********)ppppppplVar8 != &local_50) {
            Vehicle::add_node(this_00,(Point *)ppppppplVar8[2],*(int *)(ppppppplVar8 + 3),
                              (int *)&local_68);
          }
        }
        iVar2 = iVar5;
      } while (((int)local_60 == 0) &&
              (ppppppplVar10 = (long *******)ppppppplVar10[1], ppppppplVar10 != local_50));
    }
    ppppppplVar10 = local_50;
    while ((long ********)ppppppplVar10 != &local_50) {
      ppppppplVar8 = (long *******)*ppppppplVar10;
      operator_delete(ppppppplVar10);
      ppppppplVar10 = ppppppplVar8;
    }
  }
  return;
}

Assistant:

void Solution::mutate_inversion() {
    auto vit = vehicles.begin();
    std::advance(vit, rand() % vehicles.size());
    auto v1 = *vit;

    if (v1->nodes.size() < 3)
        return;
    auto range_max = rand() % (v1->nodes.size() - 2) + 2;
    auto range_min = rand() % range_max;

    auto nit = v1->nodes.begin();
    std::advance(nit, range_min);
    auto nit2 = v1->nodes.begin();
    std::advance(nit2, range_max);

    std::list<std::pair<Point *, int>> points_list;

    while (nit++ != nit2) {
        auto p = (*nit)->p;
        points_list.push_back(std::pair<Point *, int>(p, p->state[this].second));
        //v1->remove_node(p->state[this].second);//invalidate iterators
    }

    int remove_pos = (*points_list.begin()).second;
    for (auto pair: points_list) {
        v1->remove_node(remove_pos);
    }

    auto i = 0;
    for (auto rit = points_list.rbegin(); rit != points_list.rend(); ++rit) {
        auto p = (*rit).first;
        auto ec = 0;
        v1->add_node(p, range_min + i++, ec);
        if (ec != 0) {//Error, repair route
            ec = 0;
            while (--i > 0) {
                v1->remove_node(range_min);
            }
            for (auto pair: points_list) {
                v1->add_node(pair.first, pair.second, ec);
            }
            break;
        }
    }


}